

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cpp
# Opt level: O3

void __thiscall llvm::MD5::update(MD5 *this,ArrayRef<unsigned_char> Data)

{
  uint uVar1;
  uint uVar2;
  ulong __n;
  uint8_t *__dest;
  ulong __n_00;
  uint8_t *__src;
  ArrayRef<unsigned_char> Data_00;
  ArrayRef<unsigned_char> Data_01;
  
  __n = Data.Length;
  __src = Data.Data;
  uVar1 = this->lo;
  uVar2 = (int)Data.Length + uVar1 & 0x1fffffff;
  this->lo = uVar2;
  this->hi = this->hi + (int)(__n >> 0x1d) + (uint)(uVar2 < uVar1);
  if ((uVar1 & 0x3f) != 0) {
    __n_00 = 0x40 - ((ulong)uVar1 & 0x3f);
    __dest = this->buffer + ((ulong)uVar1 & 0x3f);
    if (__n < __n_00) goto LAB_001a272b;
    memcpy(__dest,__src,__n_00);
    __src = __src + __n_00;
    Data_00.Length = 0x40;
    Data_00.Data = this->buffer;
    body(this,Data_00);
    __n = __n - __n_00;
  }
  if (0x3f < __n) {
    Data_01.Length = __n & 0xffffffffffffffc0;
    Data_01.Data = __src;
    __src = body(this,Data_01);
    __n = (ulong)((uint)__n & 0x3f);
  }
  __dest = this->buffer;
LAB_001a272b:
  memcpy(__dest,__src,__n);
  return;
}

Assistant:

void MD5::update(ArrayRef<uint8_t> Data) {
  MD5_u32plus saved_lo;
  unsigned long used, free;
  const uint8_t *Ptr = Data.data();
  unsigned long Size = Data.size();

  saved_lo = lo;
  if ((lo = (saved_lo + Size) & 0x1fffffff) < saved_lo)
    hi++;
  hi += Size >> 29;

  used = saved_lo & 0x3f;

  if (used) {
    free = 64 - used;

    if (Size < free) {
      memcpy(&buffer[used], Ptr, Size);
      return;
    }

    memcpy(&buffer[used], Ptr, free);
    Ptr = Ptr + free;
    Size -= free;
    body(makeArrayRef(buffer, 64));
  }

  if (Size >= 64) {
    Ptr = body(makeArrayRef(Ptr, Size & ~(unsigned long) 0x3f));
    Size &= 0x3f;
  }

  memcpy(buffer, Ptr, Size);
}